

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O2

btSimplePair * __thiscall
btHashedSimplePairCache::findPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  btSimplePair *pbVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  
  gFindSimplePairs = gFindSimplePairs + 1;
  uVar2 = getHash(this,indexA,indexB);
  uVar3 = (long)(int)uVar2 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  if ((int)uVar3 < (this->m_hashTable).m_size) {
    pbVar1 = (this->m_overlappingPairArray).m_data;
    piVar5 = (this->m_hashTable).m_data + uVar3;
    while (lVar4 = (long)*piVar5, lVar4 != -1) {
      if ((pbVar1[lVar4].m_indexA == indexA) && (pbVar1[lVar4].m_indexB == indexB)) {
        return pbVar1 + lVar4;
      }
      piVar5 = (this->m_next).m_data + lVar4;
    }
  }
  return (btSimplePair *)0x0;
}

Assistant:

btSimplePair* btHashedSimplePairCache::findPair(int indexA, int indexB)
{
	gFindSimplePairs++;
	
	
	/*if (indexA > indexB) 
		btSwap(indexA, indexB);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_SIMPLE_NULL_PAIR && equalsPair(m_overlappingPairArray[index], indexA, indexB) == false)
	{
		index = m_next[index];
	}

	if (index == BT_SIMPLE_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}